

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::BenchmarkImp(BenchmarkImp *this,char *name)

{
  char *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,in_RSI,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1655e6);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 8;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  in_RDI[0x54] = (string)0x0;
  in_RDI[0x55] = (string)0x0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x165620);
  return;
}

Assistant:

BenchmarkImp::BenchmarkImp(const char* name)
    : name_(name), report_mode_(RM_Unspecified), time_unit_(kNanosecond),
      range_multiplier_(kRangeMultiplier), min_time_(0.0), repetitions_(0),
      use_real_time_(false), use_manual_time_(false),
      complexity_(oNone) {
}